

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::BeginValue(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
             *this)

{
  uint uVar1;
  PatternValidatorType PVar2;
  uint uVar3;
  SchemaType **ppSVar4;
  ISchemaValidator **ppIVar5;
  bool bVar6;
  int iVar7;
  Context *pCVar8;
  SchemaType *this_00;
  ISchemaValidator ***pppIVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint local_44;
  SizeType i;
  SizeType *validatorCount;
  ISchemaValidator ***va;
  bool valueUniqueness;
  PatternValidatorType patternValidatorType;
  SchemaType **sa;
  SizeType count;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  bVar6 = internal::Stack<rapidjson::CrtAllocator>::Empty(&this->schemaStack_);
  if (bVar6) {
    PushSchema(this,this->root_);
  }
  else {
    pCVar8 = CurrentContext(this);
    if ((pCVar8->inArray & 1U) != 0) {
      pCVar8 = CurrentContext(this);
      internal::TokenHelper<rapidjson::internal::Stack<rapidjson::CrtAllocator>,_char>::
      AppendIndexToken(&this->documentStack_,pCVar8->arrayElementIndex);
    }
    this_00 = CurrentSchema(this);
    pCVar8 = CurrentContext(this);
    bVar6 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::BeginValue(this_00,pCVar8);
    if ((!bVar6) && (bVar6 = GetContinueOnErrors(this), !bVar6)) {
      return false;
    }
    pCVar8 = CurrentContext(this);
    uVar1 = pCVar8->patternPropertiesSchemaCount;
    pCVar8 = CurrentContext(this);
    ppSVar4 = pCVar8->patternPropertiesSchemas;
    pCVar8 = CurrentContext(this);
    PVar2 = pCVar8->valuePatternValidatorType;
    pCVar8 = CurrentContext(this);
    bVar6 = pCVar8->valueUniqueness;
    pCVar8 = CurrentContext(this);
    if (pCVar8->valueSchema == (SchemaType *)0x0) {
      __assert_fail("CurrentContext().valueSchema",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                    ,0xbb3,
                    "bool rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>::BeginValue() [SchemaDocumentType = rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>, OutputHandler = rapidjson::BaseReaderHandler<>, StateAllocator = rapidjson::CrtAllocator]"
                   );
    }
    pCVar8 = CurrentContext(this);
    PushSchema(this,pCVar8->valueSchema);
    if (uVar1 != 0) {
      pCVar8 = CurrentContext(this);
      pCVar8->objectPatternValidatorType = PVar2;
      pCVar8 = CurrentContext(this);
      pppIVar9 = &pCVar8->patternPropertiesValidators;
      pCVar8 = CurrentContext(this);
      iVar7 = (*(this->
                super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                )._vptr_ISchemaStateFactory[7])();
      *pppIVar9 = (ISchemaValidator **)CONCAT44(extraout_var,iVar7);
      memset(*pppIVar9,0,(ulong)uVar1 << 3);
      for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
        iVar7 = (*(this->
                  super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                  )._vptr_ISchemaStateFactory[2])(this,ppSVar4[local_44],1);
        ppIVar5 = *pppIVar9;
        uVar3 = pCVar8->patternPropertiesValidatorCount;
        pCVar8->patternPropertiesValidatorCount = uVar3 + 1;
        ppIVar5[uVar3] = (ISchemaValidator *)CONCAT44(extraout_var_00,iVar7);
      }
    }
    pCVar8 = CurrentContext(this);
    pCVar8->arrayUniqueness = (bool)(bVar6 & 1);
  }
  return true;
}

Assistant:

bool BeginValue() {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::BeginValue");
        if (schemaStack_.Empty())
            PushSchema(root_);
        else {
            if (CurrentContext().inArray)
                internal::TokenHelper<internal::Stack<StateAllocator>, Ch>::AppendIndexToken(documentStack_, CurrentContext().arrayElementIndex);

            if (!CurrentSchema().BeginValue(CurrentContext()) && !GetContinueOnErrors())
                return false;

            SizeType count = CurrentContext().patternPropertiesSchemaCount;
            const SchemaType** sa = CurrentContext().patternPropertiesSchemas;
            typename Context::PatternValidatorType patternValidatorType = CurrentContext().valuePatternValidatorType;
            bool valueUniqueness = CurrentContext().valueUniqueness;
            RAPIDJSON_ASSERT(CurrentContext().valueSchema);
            PushSchema(*CurrentContext().valueSchema);

            if (count > 0) {
                CurrentContext().objectPatternValidatorType = patternValidatorType;
                ISchemaValidator**& va = CurrentContext().patternPropertiesValidators;
                SizeType& validatorCount = CurrentContext().patternPropertiesValidatorCount;
                va = static_cast<ISchemaValidator**>(MallocState(sizeof(ISchemaValidator*) * count));
                std::memset(va, 0, sizeof(ISchemaValidator*) * count);
                for (SizeType i = 0; i < count; i++)
                    va[validatorCount++] = CreateSchemaValidator(*sa[i], true);  // Inherit continueOnError
            }

            CurrentContext().arrayUniqueness = valueUniqueness;
        }
        return true;
    }